

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msf_gif.h
# Opt level: O1

int msf_gif_begin(MsfGifState *handle,int width,int height)

{
  int iVar1;
  int16_t *piVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  MsfGifBuffer *pMVar5;
  size_t __size;
  
  (handle->currentFrame).rbits = 0;
  (handle->currentFrame).gbits = 0;
  *(undefined8 *)&(handle->currentFrame).bbits = 0;
  (handle->currentFrame).pixels = (uint32_t *)0x0;
  (handle->currentFrame).depth = 0;
  (handle->currentFrame).count = 0;
  (handle->previousFrame).rbits = 0;
  (handle->previousFrame).gbits = 0;
  *(undefined8 *)&(handle->previousFrame).bbits = 0;
  (handle->previousFrame).pixels = (uint32_t *)0x0;
  (handle->previousFrame).depth = 0;
  (handle->previousFrame).count = 0;
  handle->width = width;
  handle->height = height;
  handle->framesSubmitted = 0;
  piVar2 = (int16_t *)malloc(0x200000);
  handle->lzwMem = piVar2;
  __size = (long)(height * width) << 2;
  puVar3 = (uint32_t *)malloc(__size);
  (handle->previousFrame).pixels = puVar3;
  puVar4 = (uint32_t *)malloc(__size);
  (handle->currentFrame).pixels = puVar4;
  pMVar5 = (MsfGifBuffer *)malloc(0x30);
  handle->listHead = pMVar5;
  if ((((puVar4 == (uint32_t *)0x0) || (puVar3 == (uint32_t *)0x0)) || (piVar2 == (int16_t *)0x0))
     || (pMVar5 == (MsfGifBuffer *)0x0)) {
    msf_free_gif_state(handle);
    iVar1 = 0;
  }
  else {
    handle->listTail = pMVar5;
    pMVar5->next = (MsfGifBuffer *)0x0;
    pMVar5->size = 0x20;
    *(ulong *)pMVar5->data = (ulong)(uint)width << 0x30 | 0x613938464947;
    *(short *)&pMVar5[1].next = (short)height;
    *(undefined8 *)((long)&pMVar5[1].next + 2) = 0x454e0bff21000070;
    *(undefined8 *)((long)&pMVar5[1].size + 2) = 0x2e32455041435354;
    *(undefined8 *)pMVar5[1].data = 0x103302e32;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int msf_gif_begin(MsfGifState * handle, int width, int height) { MsfTimeFunc
    //NOTE: we cannot stomp the entire struct to zero because we must preserve `customAllocatorContext`.
    MsfCookedFrame empty = {0}; //god I hate MSVC...
    handle->previousFrame = empty;
    handle->currentFrame = empty;
    handle->width = width;
    handle->height = height;
    handle->framesSubmitted = 0;

    //allocate memory for LZW buffer
    //NOTE: Unfortunately we can't just use stack memory for the LZW table because it's 2MB,
    //      which is more stack space than most operating systems give by default,
    //      and we can't realistically expect users to be willing to override that just to use our library,
    //      so we have to allocate this on the heap.
    handle->lzwMem = (int16_t *) MSF_GIF_MALLOC(handle->customAllocatorContext, lzwAllocSize);
    handle->previousFrame.pixels =
        (uint32_t *) MSF_GIF_MALLOC(handle->customAllocatorContext, handle->width * handle->height * sizeof(uint32_t));
    handle->currentFrame.pixels =
        (uint32_t *) MSF_GIF_MALLOC(handle->customAllocatorContext, handle->width * handle->height * sizeof(uint32_t));

    //setup header buffer header (lol)
    handle->listHead = (MsfGifBuffer *) MSF_GIF_MALLOC(handle->customAllocatorContext, offsetof(MsfGifBuffer, data) + 32);
    if (!handle->listHead || !handle->lzwMem || !handle->previousFrame.pixels || !handle->currentFrame.pixels) {
        msf_free_gif_state(handle);
        return 0;
    }
    handle->listTail = handle->listHead;
    handle->listHead->next = NULL;
    handle->listHead->size = 32;

    //NOTE: because __attribute__((__packed__)) is annoyingly compiler-specific, we do this unreadable weirdness
    char headerBytes[33] = "GIF89a\0\0\0\0\x70\0\0" "\x21\xFF\x0BNETSCAPE2.0\x03\x01\0\0\0";
    memcpy(&headerBytes[6], &width, 2);
    memcpy(&headerBytes[8], &height, 2);
    memcpy(handle->listHead->data, headerBytes, 32);
    return 1;
}